

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# privparent.c
# Opt level: O0

void privop_pasv_active(session_t *sess)

{
  uint local_14;
  int active;
  session_t *sess_local;
  
  local_14 = (uint)(sess->pasv_listen_fd != -1);
  priv_sock_send_int(sess->parent_fd,local_14);
  return;
}

Assistant:

void privop_pasv_active(session_t *sess) {
  int active;
  if (sess->pasv_listen_fd != -1) {
    active = 1;
  } else {
    active = 0;
  }
  priv_sock_send_int(sess->parent_fd, active);
}